

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O2

int __thiscall
ncnn::BinaryOp_x86_avx2::forward_inplace(BinaryOp_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256 afVar11;
  int iVar12;
  int iVar13;
  undefined1 (*pauVar14) [32];
  undefined1 (*pauVar15) [16];
  int iVar16;
  int iVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  undefined1 auVar22 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [56];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 in_ZMM2 [64];
  __m128 afVar31;
  binary_op_pow_pack8 op;
  __m256 _b;
  binary_op_pow_pack8 local_121;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [3] [32];
  __m256 local_80 [2];
  undefined1 auVar30 [64];
  
  afVar11 = local_80[0];
  p_Var2 = this->_vptr_BinaryOp_x86_avx2[-3];
  if (bottom_top_blob->elempack == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
    case 0:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar19._0_4_ = local_120 + *(float *)*pauVar15;
          auVar19._4_4_ = fStack_11c + *(float *)(*pauVar15 + 4);
          auVar19._8_4_ = fStack_118 + *(float *)(*pauVar15 + 8);
          auVar19._12_4_ = fStack_114 + *(float *)(*pauVar15 + 0xc);
          *pauVar15 = auVar19;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 1:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar8._4_4_ = fStack_11c;
        auVar8._0_4_ = local_120;
        auVar8._8_4_ = fStack_118;
        auVar8._12_4_ = fStack_114;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar6 = vsubps_avx(*pauVar15,auVar8);
          *pauVar15 = auVar6;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 2:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar20._0_4_ = local_120 * *(float *)*pauVar15;
          auVar20._4_4_ = fStack_11c * *(float *)(*pauVar15 + 4);
          auVar20._8_4_ = fStack_118 * *(float *)(*pauVar15 + 8);
          auVar20._12_4_ = fStack_114 * *(float *)(*pauVar15 + 0xc);
          *pauVar15 = auVar20;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 3:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar21._0_4_ = local_120 * *(float *)*pauVar15;
          auVar21._4_4_ = fStack_11c * *(float *)(*pauVar15 + 4);
          auVar21._8_4_ = fStack_118 * *(float *)(*pauVar15 + 8);
          auVar21._12_4_ = fStack_114 * *(float *)(*pauVar15 + 0xc);
          *pauVar15 = auVar21;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 4:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar7._4_4_ = fStack_11c;
        auVar7._0_4_ = local_120;
        auVar7._8_4_ = fStack_118;
        auVar7._12_4_ = fStack_114;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar6 = vmaxps_avx(auVar7,*pauVar15);
          *pauVar15 = auVar6;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 5:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar5._4_4_ = fStack_11c;
        auVar5._0_4_ = local_120;
        auVar5._8_4_ = fStack_118;
        auVar5._12_4_ = fStack_114;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar6 = vminps_avx(auVar5,*pauVar15);
          *pauVar15 = auVar6;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 6:
      local_80[0][1] = *(float *)(&this->field_0xd8 + (long)p_Var2);
      local_80[0][0] = local_80[0][1];
      local_80[0][2] = local_80[0][1];
      local_80[0][3] = local_80[0][1];
      local_e8 = bottom_top_blob->h * bottom_top_blob->w;
      local_80[0]._16_16_ = afVar11._16_16_;
      local_120 = 0.0;
      if (local_e8 < 1) {
        local_e8 = 0;
      }
      local_e4 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        local_e4 = (int)local_120;
      }
      for (; local_120 != (float)local_e4; local_120 = (float)((int)local_120 + 1)) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,(int)local_120);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar12 = local_e8;
        while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
          auVar27 = ZEXT856(*(ulong *)(*pauVar15 + 8));
          local_e0[0]._0_16_ = *pauVar15;
          afVar31 = binary_op_pow_pack4::operator()
                              ((binary_op_pow_pack4 *)&local_121,(__m128 *)local_e0,
                               (__m128 *)local_80);
          auVar25._0_8_ = afVar31._0_8_;
          auVar25._8_56_ = auVar27;
          *pauVar15 = auVar25._0_16_;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 7:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar3._4_4_ = fStack_11c;
        auVar3._0_4_ = local_120;
        auVar3._8_4_ = fStack_118;
        auVar3._12_4_ = fStack_114;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar6 = vsubps_avx(auVar3,*pauVar15);
          *pauVar15 = auVar6;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    case 8:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar15 = (undefined1 (*) [16])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar6._4_4_ = fStack_11c;
        auVar6._0_4_ = local_120;
        auVar6._8_4_ = fStack_118;
        auVar6._12_4_ = fStack_114;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar3 = vrcpps_avx(*pauVar15);
          auVar28._0_4_ = local_120 * auVar3._0_4_;
          auVar28._4_4_ = fStack_11c * auVar3._4_4_;
          auVar28._8_4_ = fStack_118 * auVar3._8_4_;
          auVar28._12_4_ = fStack_114 * auVar3._12_4_;
          auVar5 = vfmsub213ps_fma(*pauVar15,auVar28,auVar6);
          auVar3 = vfnmadd213ps_fma(auVar5,auVar3,auVar28);
          *pauVar15 = auVar3;
          pauVar15 = pauVar15 + 1;
        }
      }
      break;
    default:
      goto switchD_0022e0cc_default;
    }
    goto LAB_0022ea8e;
  }
  if (bottom_top_blob->elempack == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
    case 0:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar22._0_4_ = local_120 + *(float *)*pauVar14;
          auVar22._4_4_ = fStack_11c + *(float *)(*pauVar14 + 4);
          auVar22._8_4_ = fStack_118 + *(float *)(*pauVar14 + 8);
          auVar22._12_4_ = fStack_114 + *(float *)(*pauVar14 + 0xc);
          auVar22._16_4_ = fStack_110 + *(float *)(*pauVar14 + 0x10);
          auVar22._20_4_ = fStack_10c + *(float *)(*pauVar14 + 0x14);
          auVar22._24_4_ = fStack_108 + *(float *)(*pauVar14 + 0x18);
          auVar22._28_4_ = fStack_104 + *(float *)(*pauVar14 + 0x1c);
          *pauVar14 = auVar22;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 1:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar10._4_4_ = fStack_11c;
        auVar10._0_4_ = local_120;
        auVar10._8_4_ = fStack_118;
        auVar10._12_4_ = fStack_114;
        auVar10._16_4_ = fStack_110;
        auVar10._20_4_ = fStack_10c;
        auVar10._24_4_ = fStack_108;
        auVar10._28_4_ = fStack_104;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar23 = vsubps_avx(*pauVar14,auVar10);
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 2:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        in_ZMM0 = ZEXT1664(in_ZMM0._0_16_);
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar24._0_4_ = local_120 * *(float *)*pauVar14;
          auVar24._4_4_ = fStack_11c * *(float *)(*pauVar14 + 4);
          auVar24._8_4_ = fStack_118 * *(float *)(*pauVar14 + 8);
          auVar24._12_4_ = fStack_114 * *(float *)(*pauVar14 + 0xc);
          auVar24._16_4_ = fStack_110 * *(float *)(*pauVar14 + 0x10);
          auVar24._20_4_ = fStack_10c * *(float *)(*pauVar14 + 0x14);
          auVar24._28_36_ = in_ZMM0._28_36_;
          auVar24._24_4_ = fStack_108 * *(float *)(*pauVar14 + 0x18);
          in_ZMM0 = ZEXT3264(auVar24._0_32_);
          *pauVar14 = auVar24._0_32_;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 3:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
      auVar25 = ZEXT1664(CONCAT124(SUB6012((undefined1  [60])0x0,0),local_120));
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        auVar25 = ZEXT1664(auVar25._0_16_);
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar26._0_4_ = local_120 * *(float *)*pauVar14;
          auVar26._4_4_ = fStack_11c * *(float *)(*pauVar14 + 4);
          auVar26._8_4_ = fStack_118 * *(float *)(*pauVar14 + 8);
          auVar26._12_4_ = fStack_114 * *(float *)(*pauVar14 + 0xc);
          auVar26._16_4_ = fStack_110 * *(float *)(*pauVar14 + 0x10);
          auVar26._20_4_ = fStack_10c * *(float *)(*pauVar14 + 0x14);
          auVar26._28_36_ = auVar25._28_36_;
          auVar26._24_4_ = fStack_108 * *(float *)(*pauVar14 + 0x18);
          auVar25 = ZEXT3264(auVar26._0_32_);
          *pauVar14 = auVar26._0_32_;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 4:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar9._4_4_ = fStack_11c;
        auVar9._0_4_ = local_120;
        auVar9._8_4_ = fStack_118;
        auVar9._12_4_ = fStack_114;
        auVar9._16_4_ = fStack_110;
        auVar9._20_4_ = fStack_10c;
        auVar9._24_4_ = fStack_108;
        auVar9._28_4_ = fStack_104;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar23 = vmaxps_avx(auVar9,*pauVar14);
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 5:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar29._4_4_ = fStack_11c;
        auVar29._0_4_ = local_120;
        auVar29._8_4_ = fStack_118;
        auVar29._12_4_ = fStack_114;
        auVar29._16_4_ = fStack_110;
        auVar29._20_4_ = fStack_10c;
        auVar29._24_4_ = fStack_108;
        auVar29._28_4_ = fStack_104;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar23 = vminps_avx(auVar29,*pauVar14);
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 6:
      fVar1 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      local_80[0][1] = fVar1;
      local_80[0][0] = fVar1;
      local_80[0][2] = fVar1;
      local_80[0][3] = fVar1;
      local_80[0][4] = fVar1;
      local_80[0][5] = fVar1;
      local_80[0][6] = fVar1;
      local_80[0][7] = fVar1;
      local_e8 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = 0.0;
      if (local_e8 < 1) {
        local_e8 = 0;
      }
      local_e4 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        local_e4 = (int)local_120;
      }
      for (; local_120 != (float)local_e4; local_120 = (float)((int)local_120 + 1)) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,(int)local_120);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        iVar12 = local_e8;
        while (bVar18 = iVar12 != 0, iVar12 = iVar12 + -1, bVar18) {
          local_e0[0] = *pauVar14;
          auVar23 = local_e0[0];
          binary_op_pow_pack8::operator()(&local_121,(__m256 *)local_e0,local_80);
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 7:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar4._4_4_ = fStack_11c;
        auVar4._0_4_ = local_120;
        auVar4._8_4_ = fStack_118;
        auVar4._12_4_ = fStack_114;
        auVar4._16_4_ = fStack_110;
        auVar4._20_4_ = fStack_10c;
        auVar4._24_4_ = fStack_108;
        auVar4._28_4_ = fStack_104;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar23 = vsubps_avx(auVar4,*pauVar14);
          *pauVar14 = auVar23;
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    case 8:
      iVar12 = bottom_top_blob->h * bottom_top_blob->w;
      local_120 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      iVar17 = 0;
      if (iVar12 < 1) {
        iVar12 = iVar17;
      }
      iVar16 = bottom_top_blob->c;
      if (bottom_top_blob->c < 1) {
        iVar16 = 0;
      }
      fStack_11c = local_120;
      fStack_118 = local_120;
      fStack_114 = local_120;
      fStack_110 = local_120;
      fStack_10c = local_120;
      fStack_108 = local_120;
      fStack_104 = local_120;
      for (; iVar17 != iVar16; iVar17 = iVar17 + 1) {
        in_ZMM2 = ZEXT1664(in_ZMM2._0_16_);
        Mat::channel((Mat *)local_e0,bottom_top_blob,iVar17);
        pauVar14 = (undefined1 (*) [32])local_e0[0]._0_8_;
        Mat::~Mat((Mat *)local_e0);
        auVar23._4_4_ = fStack_11c;
        auVar23._0_4_ = local_120;
        auVar23._8_4_ = fStack_118;
        auVar23._12_4_ = fStack_114;
        auVar23._16_4_ = fStack_110;
        auVar23._20_4_ = fStack_10c;
        auVar23._24_4_ = fStack_108;
        auVar23._28_4_ = fStack_104;
        iVar13 = iVar12;
        while (bVar18 = iVar13 != 0, iVar13 = iVar13 + -1, bVar18) {
          auVar4 = vrcpps_avx(*pauVar14);
          auVar30._0_4_ = local_120 * auVar4._0_4_;
          auVar30._4_4_ = fStack_11c * auVar4._4_4_;
          auVar30._8_4_ = fStack_118 * auVar4._8_4_;
          auVar30._12_4_ = fStack_114 * auVar4._12_4_;
          auVar30._16_4_ = fStack_110 * auVar4._16_4_;
          auVar30._20_4_ = fStack_10c * auVar4._20_4_;
          auVar30._28_36_ = in_ZMM2._28_36_;
          auVar30._24_4_ = fStack_108 * auVar4._24_4_;
          auVar29 = auVar30._0_32_;
          in_ZMM2 = ZEXT3264(auVar29);
          auVar6 = vfmsub213ps_fma(*pauVar14,auVar29,auVar23);
          auVar6 = vfnmadd213ps_fma(ZEXT1632(auVar6),auVar4,auVar29);
          *pauVar14 = ZEXT1632(auVar6);
          pauVar14 = pauVar14 + 1;
        }
      }
      break;
    default:
      goto switchD_0022e0cc_default;
    }
LAB_0022ea8e:
    iVar12 = 0;
  }
  else {
switchD_0022e0cc_default:
    iVar12 = BinaryOp::forward_inplace
                       ((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_avx2 + (long)p_Var2),
                        bottom_top_blob,opt);
  }
  return iVar12;
}

Assistant:

int BinaryOp_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}